

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

void __thiscall duckdb::StorageManager::~StorageManager(StorageManager *this)

{
  _Head_base<0UL,_duckdb::WriteAheadLog_*,_false> _Var1;
  pointer pcVar2;
  
  this->_vptr_StorageManager = (_func_int **)&PTR__StorageManager_0248a400;
  _Var1._M_head_impl =
       (this->wal).
       super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>._M_t.
       super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
       super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (WriteAheadLog *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_WriteAheadLog + 8))();
  }
  (this->wal).super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
  _M_t.super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>.
  super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl = (WriteAheadLog *)0x0;
  pcVar2 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->path).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

StorageManager::~StorageManager() {
}